

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O2

void __thiscall
QueryTests_DeleteFrom_canDetermineSpecificationForDeleteFrom_Test::TestBody
          (QueryTests_DeleteFrom_canDetermineSpecificationForDeleteFrom_Test *this)

{
  bool bVar1;
  long lVar2;
  char *in_R9;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_03;
  allocator_type local_3d4;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3d3;
  allocator_type local_3d2;
  allocator_type local_3d1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_3d0;
  api_filter_type filter2;
  AssertionResult gtest_ar__5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_350;
  AssertionResult gtest_ar_;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_2f0;
  api_filter_type filter1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_288;
  ComparisonType local_26c [3];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_260;
  Query query_delete_from2;
  Query query_delete_from1;
  
  database::Query::Query(&query_delete_from1,"delete from company.employee where employee_id = 1");
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = query_delete_from1.m_transaction_type == delete_from;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = query_delete_from1.m_transaction_metatype == dml;
    if (gtest_ar_.success_) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string
                ((string *)&query_delete_from2,(string *)&query_delete_from1.m_database_name);
      gtest_ar_.success_ = std::operator==(&query_delete_from2.m_query_string,"company");
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__cxx11::string::~string((string *)&query_delete_from2);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&query_delete_from2.m_query_string,(internal *)&gtest_ar_,
                   (AssertionResult *)"query_delete_from1.databaseName() == \"company\"","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&filter1,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                   ,0xd9,query_delete_from2.m_query_string._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&filter1,(Message *)&gtest_ar__5)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        std::__cxx11::string::string
                  ((string *)&query_delete_from2,(string *)&query_delete_from1.m_container_name);
        gtest_ar_.success_ = std::operator==(&query_delete_from2.m_query_string,"employee");
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::__cxx11::string::~string((string *)&query_delete_from2);
        if (gtest_ar_.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          filter2._M_t._M_impl._0_4_ = 0;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
          ::pair<const_char_(&)[2],_database::ComparisonType,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                      *)&gtest_ar_,(char (*) [2])0x130252,(ComparisonType *)&filter2);
          __l._M_len = 1;
          __l._M_array = (iterator)&gtest_ar_;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    *)&gtest_ar__5,__l,(allocator_type *)&local_3d0);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
          ::pair<const_char_(&)[12],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      *)&query_delete_from2,(char (*) [12])"employee_id",
                     (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      *)&gtest_ar__5);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&query_delete_from2;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::map(&filter1,__l_00,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_288,(allocator_type *)&local_260);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                   *)&query_delete_from2);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                     *)&gtest_ar__5);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      *)&query_delete_from2,&query_delete_from1.m_filter._M_t);
          gtest_ar_.success_ =
               std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                *)&query_delete_from2,&filter1._M_t);
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                       *)&query_delete_from2);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__5);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&query_delete_from2.m_query_string,(internal *)&gtest_ar_,
                       (AssertionResult *)"query_delete_from1.filter() == filter1","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&filter2,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                       ,0xde,query_delete_from2.m_query_string._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&filter2,(Message *)&gtest_ar__5);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&filter2);
            std::__cxx11::string::~string((string *)&query_delete_from2);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__5);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            database::Query::Query
                      (&query_delete_from2,
                       "delete from company.employee where employee_status <> fulltime and employee_join_date >= 20180223 and employee_join_date < 20190212"
                      );
            gtest_ar__5.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            gtest_ar__5.success_ = query_delete_from2.m_transaction_type == delete_from;
            if (gtest_ar__5.success_) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
              gtest_ar__5.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              gtest_ar__5.success_ = query_delete_from2.m_transaction_metatype == dml;
              if (!gtest_ar__5.success_) {
                testing::Message::Message((Message *)&filter2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                           (AssertionResult *)
                           "query_delete_from2.transactionMetaType() == database::dml","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_3d0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0xe2,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_3d0,(Message *)&filter2);
                goto LAB_00113269;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
              std::__cxx11::string::string
                        ((string *)&gtest_ar_,(string *)&query_delete_from2.m_database_name);
              gtest_ar__5.success_ =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&gtest_ar_,"company");
              gtest_ar__5.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              std::__cxx11::string::~string((string *)&gtest_ar_);
              if (gtest_ar__5.success_ == false) {
                testing::Message::Message((Message *)&filter2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                           (AssertionResult *)"query_delete_from2.databaseName() == \"company\"",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_3d0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0xe3,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_3d0,(Message *)&filter2);
                goto LAB_00113269;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
              std::__cxx11::string::string
                        ((string *)&gtest_ar_,(string *)&query_delete_from2.m_container_name);
              gtest_ar__5.success_ =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&gtest_ar_,"employee");
              gtest_ar__5.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              std::__cxx11::string::~string((string *)&gtest_ar_);
              if (gtest_ar__5.success_ == false) {
                testing::Message::Message((Message *)&filter2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                           (AssertionResult *)"query_delete_from2.containerName() == \"employee\"",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_3d0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0xe4,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_3d0,(Message *)&filter2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
                std::__cxx11::string::~string((string *)&gtest_ar_);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&filter2);
                goto LAB_0011328d;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
              local_26c[2] = 1;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
              ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                        (&local_3d0,(char (*) [9])"fulltime",local_26c + 2);
              __l_01._M_len = 1;
              __l_01._M_array = &local_3d0;
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
              ::vector(&local_288,__l_01,&local_3d1);
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
              ::pair<const_char_(&)[16],_true>
                        ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                          *)&gtest_ar_,(char (*) [16])"employee_status",&local_288);
              local_26c[1] = 2;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
              ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                          *)&gtest_ar__5,(char (*) [9])"20180223",local_26c + 1);
              local_26c[0] = lesser_than;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
              ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                        (&local_350,(char (*) [9])0x1319f7,local_26c);
              __l_02._M_len = 2;
              __l_02._M_array = (iterator)&gtest_ar__5;
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
              ::vector(&local_260,__l_02,&local_3d2);
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
              ::pair<const_char_(&)[19],_true>
                        (&local_2f0,(char (*) [19])"employee_join_date",&local_260);
              __l_03._M_len = 2;
              __l_03._M_array = (iterator)&gtest_ar_;
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
              ::map(&filter2,__l_03,&local_3d3,&local_3d4);
              lVar2 = 0x38;
              do {
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                         *)(&gtest_ar_.success_ + lVar2));
                lVar2 = lVar2 + -0x38;
              } while (lVar2 != -0x38);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
              ::~vector(&local_260);
              lVar2 = 0x28;
              do {
                std::__cxx11::string::~string((string *)(&gtest_ar__5.success_ + lVar2));
                lVar2 = lVar2 + -0x28;
              } while (lVar2 != -0x28);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
              ::~vector(&local_288);
              std::__cxx11::string::~string((string *)&local_3d0);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
              ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                          *)&gtest_ar_,&query_delete_from2.m_filter._M_t);
              bVar1 = std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                       *)&gtest_ar_,&filter2._M_t);
              gtest_ar__5.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              gtest_ar__5.success_ = bVar1;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                           *)&gtest_ar_);
              if (!bVar1) {
                testing::Message::Message((Message *)&local_3d0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                           (AssertionResult *)"query_delete_from2.filter() == filter2","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_288,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0xe9,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_288,(Message *)&local_3d0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
                std::__cxx11::string::~string((string *)&gtest_ar_);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_3d0);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
              ::~_Rb_tree(&filter2._M_t);
            }
            else {
              testing::Message::Message((Message *)&filter2);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                         (AssertionResult *)
                         "query_delete_from2.transactionType() == database::delete_from","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_3d0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                         ,0xe1,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_3d0,(Message *)&filter2);
LAB_00113269:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
              std::__cxx11::string::~string((string *)&gtest_ar_);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&filter2);
LAB_0011328d:
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
            }
            database::Query::~Query(&query_delete_from2);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~_Rb_tree(&filter1._M_t);
          goto LAB_00113090;
        }
        testing::Message::Message((Message *)&gtest_ar__5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&query_delete_from2.m_query_string,(internal *)&gtest_ar_,
                   (AssertionResult *)"query_delete_from1.containerName() == \"employee\"","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&filter1,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                   ,0xda,query_delete_from2.m_query_string._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&filter1,(Message *)&gtest_ar__5)
        ;
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar__5);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&query_delete_from2.m_query_string,(internal *)&gtest_ar_,
                 (AssertionResult *)"query_delete_from1.transactionMetaType() == database::dml",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&filter1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xd8,query_delete_from2.m_query_string._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&filter1,(Message *)&gtest_ar__5);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&query_delete_from2.m_query_string,(internal *)&gtest_ar_,
               (AssertionResult *)"query_delete_from1.transactionType() == database::delete_from",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&filter1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0xd7,query_delete_from2.m_query_string._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&filter1,(Message *)&gtest_ar__5);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&filter1);
  std::__cxx11::string::~string((string *)&query_delete_from2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar__5);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
LAB_00113090:
  database::Query::~Query(&query_delete_from1);
  return;
}

Assistant:

TEST(QueryTests_DeleteFrom,canDetermineSpecificationForDeleteFrom)
{
  database::Query query_delete_from1 = "delete from company.employee where employee_id = 1";
  ASSERT_TRUE(query_delete_from1.transactionType() == database::delete_from);
  ASSERT_TRUE(query_delete_from1.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_delete_from1.databaseName() == "company");
  ASSERT_TRUE(query_delete_from1.containerName() == "employee");
  database::api_filter_type filter1 = {
    {"employee_id",{{"1",database::equal_to}}}
  };
  ASSERT_TRUE(query_delete_from1.filter() == filter1);

  database::Query query_delete_from2 = "delete from company.employee where employee_status <> fulltime and employee_join_date >= 20180223 and employee_join_date < 20190212";
  ASSERT_TRUE(query_delete_from2.transactionType() == database::delete_from);
  ASSERT_TRUE(query_delete_from2.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_delete_from2.databaseName() == "company");
  ASSERT_TRUE(query_delete_from2.containerName() == "employee");
  database::api_filter_type filter2 = {
    {"employee_status",{{"fulltime",database::not_equal_to}}},
    {"employee_join_date",{{"20180223",database::greater_or_equal_to},{"20190212",database::lesser_than}}}
  };
  ASSERT_TRUE(query_delete_from2.filter() == filter2);
}